

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::EndFunction(TypeChecker *this)

{
  LabelType LVar1;
  Result RVar2;
  Enum EVar3;
  Label *in_RAX;
  Label *label;
  Label *local_18;
  
  local_18 = in_RAX;
  RVar2 = GetLabel(this,0,&local_18);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    LVar1 = local_18->label_type;
    RVar2 = OnEnd(this,local_18,"implicit return","function");
    EVar3 = (Enum)(RVar2.enum_ == Error || LVar1 != First);
  }
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::EndFunction() {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  result |= CheckLabelType(label, LabelType::Func);
  result |= OnEnd(label, "implicit return", "function");
  return result;
}